

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_assert.hpp
# Opt level: O0

void debug_assert::detail::debug_assertion_failed<type_safe::detail::precondition_error_handler>
               (source_location *loc,char *expression)

{
  char *expression_local;
  source_location *loc_local;
  
  default_handler::handle(loc,expression,(char *)0x0);
  abort();
}

Assistant:

regular_void debug_assertion_failed(const source_location& loc, const char* expression,
                                        Args&&... args)
    {
#if defined(_MSC_VER)
#    pragma warning(push)
#    pragma warning(disable : 4702)
#endif
        return Handler::handle(loc, expression, detail::forward<Args>(args)...), std::abort(),
               regular_void();
#if defined(_MSC_VER)
#    pragma warning(pop)
#endif
    }